

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::test_libskiwi_externals::test(test_libskiwi_externals *this)

{
  unsigned_long val;
  char *pcVar1;
  skiwi *this_00;
  allocator<char> local_b1;
  string local_b0 [32];
  unsigned_long local_90;
  uint64_t value;
  undefined8 uStack_80;
  undefined8 uStack_48;
  skiwi_parameters pars;
  test_libskiwi_externals *this_local;
  
  skiwi::skiwi_parameters::skiwi_parameters((skiwi_parameters *)&uStack_48);
  uStack_48 = 0x100000;
  value = 0x100000;
  uStack_80 = _pars;
  skiwi::scheme_with_skiwi(anon_unknown_210::test_libskiwi_externals_register_fie,0);
  std::allocator<char>::allocator();
  pcVar1 = "(check-pair (cons 1 2))";
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"(check-pair (cons 1 2))",&local_b1);
  val = skiwi::skiwi_run_raw((skiwi *)local_b0,(string *)pcVar1);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  this_00 = (skiwi *)0x2;
  local_90 = val;
  TestEq<int,unsigned_long>
            (2,val,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1759,"void skiwi::(anonymous namespace)::test_libskiwi_externals::test()");
  skiwi::skiwi_quit(this_00);
  return;
}

Assistant:

void test()
      {
      skiwi::skiwi_parameters pars;
      pars.heap_size = 1024 * 1024;
      skiwi::scheme_with_skiwi(&test_libskiwi_externals_register_fie, nullptr, pars);
      uint64_t value = skiwi_run_raw("(check-pair (cons 1 2))");
      TEST_EQ(1 << fixnum_shift, value);
      skiwi::skiwi_quit();
      }